

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

ssize_t __thiscall
kj::anon_unknown_31::HttpFixedLengthEntityWriter::write
          (HttpFixedLengthEntityWriter *this,int __fd,void *__buf,size_t __n)

{
  Disposer *pDVar1;
  Disposer *pDVar2;
  undefined4 in_register_00000034;
  Promise<void> *promise;
  long lVar3;
  void *pvVar4;
  ArrayPtr<const_kj::ArrayPtr<const_unsigned_char>_> pieces;
  Fault f;
  Fault local_30;
  Own<kj::_::PromiseNode> local_28;
  
  promise = (Promise<void> *)CONCAT44(in_register_00000034,__fd);
  pDVar2 = (Disposer *)0x0;
  pvVar4 = __buf;
  for (lVar3 = __n << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    pDVar2 = (Disposer *)((long)&pDVar2->_vptr_Disposer + *(long *)((long)pvVar4 + 8));
    pvVar4 = (void *)((long)pvVar4 + 0x10);
  }
  if (pDVar2 == (Disposer *)0x0) {
    Promise<void>::Promise((Promise<void> *)this);
  }
  else {
    pDVar1 = promise[1].super_PromiseBase.node.disposer;
    if (pDVar1 < pDVar2) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[25]>
                (&local_30,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/compat/http.c++"
                 ,0x72b,FAILED,"size <= length","\"overwrote Content-Length\"",
                 (char (*) [25])"overwrote Content-Length");
      _::Debug::Fault::fatal(&local_30);
    }
    promise[1].super_PromiseBase.node.disposer = (Disposer *)((long)pDVar1 - (long)pDVar2);
    pieces.size_ = (size_t)__buf;
    pieces.ptr = (ArrayPtr<const_unsigned_char> *)(promise->super_PromiseBase).node.ptr;
    HttpOutputStream::writeBodyData((HttpOutputStream *)&local_28,pieces);
    maybeFinishAfter(this,promise);
    Own<kj::_::PromiseNode>::dispose(&local_28);
  }
  return (ssize_t)this;
}

Assistant:

Promise<void> write(ArrayPtr<const ArrayPtr<const byte>> pieces) override {
    uint64_t size = 0;
    for (auto& piece: pieces) size += piece.size();

    if (size == 0) return kj::READY_NOW;
    KJ_REQUIRE(size <= length, "overwrote Content-Length");
    length -= size;

    return maybeFinishAfter(inner.writeBodyData(pieces));
  }